

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asc2log.c
# Opt level: O1

void calc_tv(timeval *tv,timeval *read_tv,timeval *date_tv,char timestamps,int dplace)

{
  long lVar1;
  int iVar2;
  undefined7 in_register_00000009;
  
  iVar2 = (int)CONCAT71(in_register_00000009,timestamps);
  if (iVar2 == 4) {
    lVar1 = 100;
  }
  else {
    if (iVar2 != 5) goto LAB_001027d7;
    lVar1 = 10;
  }
  read_tv->tv_usec = lVar1 * read_tv->tv_usec;
LAB_001027d7:
  if ((char)date_tv == 'a') {
    tv->tv_sec = read_tv->tv_sec + main::date_tv.tv_sec;
    tv->tv_usec = read_tv->tv_usec + main::date_tv.tv_usec;
  }
  else {
    if (((tv->tv_sec == 0) && (tv->tv_usec == 0)) &&
       (main::date_tv.tv_usec != 0 || main::date_tv.tv_sec != 0)) {
      tv->tv_sec = main::date_tv.tv_sec;
      tv->tv_usec = main::date_tv.tv_usec;
    }
    tv->tv_sec = tv->tv_sec + read_tv->tv_sec;
    tv->tv_usec = tv->tv_usec + read_tv->tv_usec;
  }
  if (999999 < tv->tv_usec) {
    tv->tv_usec = tv->tv_usec + -1000000;
    tv->tv_sec = tv->tv_sec + 1;
  }
  return;
}

Assistant:

static void calc_tv(struct timeval *tv, struct timeval *read_tv,
		    struct timeval *date_tv, char timestamps, int dplace)
{
	if (dplace == 4) /* shift values having only 4 decimal places */
		read_tv->tv_usec *= 100;                /* and need for 6 */

	if (dplace == 5) /* shift values having only 5 decimal places */
		read_tv->tv_usec *= 10;                /* and need for 6 */

	if (timestamps == 'a') { /* absolute */

		tv->tv_sec  = date_tv->tv_sec  + read_tv->tv_sec;
		tv->tv_usec = date_tv->tv_usec + read_tv->tv_usec;

	} else { /* relative */

		if (((!tv->tv_sec) && (!tv->tv_usec)) && 
		    (date_tv->tv_sec || date_tv->tv_usec)) {
			tv->tv_sec  = date_tv->tv_sec; /* initial date/time */
			tv->tv_usec = date_tv->tv_usec;
		}

		tv->tv_sec  += read_tv->tv_sec;
		tv->tv_usec += read_tv->tv_usec;
	}

	if (tv->tv_usec >= 1000000) {
		tv->tv_usec -= 1000000;
		tv->tv_sec++;
	}
}